

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.cpp
# Opt level: O2

void __thiscall ot::commissioner::BorderAgent::State::State(State *this,uint32_t aState)

{
  State(this,aState >> 6 & 7,aState >> 4 & 3,aState >> 2 & 3,aState >> 1 & 1,aState & 1);
  return;
}

Assistant:

BorderAgent::State::State(uint32_t aState)
    : State((aState & kConnectionModeMask) >> kConnectionModeOffset,
            (aState & kThreadIfStatusMask) >> kThreadIfStatusOffset,
            (aState & kAvailabilityMask) >> kAvailabilityOffset,
            (aState & kBbrIsActiveMask) >> kBbrIsActiveOffset,
            (aState & kBbrIsPrimaryMask) >> kBbrIsPrimaryOffset)
{
}